

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_fill_rect(nk_command_buffer *b,nk_rect rect,float rounding,nk_color c)

{
  float fVar1;
  void *pvVar2;
  float fVar3;
  float fVar6;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar7;
  float fVar9;
  undefined1 auVar8 [16];
  float fStack_20;
  float fStack_1c;
  
  if (b == (nk_command_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x22b4,
                  "void nk_fill_rect(struct nk_command_buffer *, struct nk_rect, float, struct nk_color)"
                 );
  }
  if (0xffffff < (uint)c) {
    fVar7 = rect.w;
    if ((fVar7 != 0.0) || (NAN(fVar7))) {
      fVar9 = rect.h;
      if ((fVar9 != 0.0) || (NAN(fVar9))) {
        fVar3 = rect.x;
        fVar6 = rect.y;
        if (b->use_clipping != 0) {
          fVar1 = (b->clip).x;
          if (fVar3 + fVar7 < fVar1) {
            return;
          }
          if (fVar1 + (b->clip).w < fVar3) {
            return;
          }
          fVar7 = (b->clip).y;
          if (fVar9 + fVar6 < fVar7) {
            return;
          }
          if (fVar7 + (b->clip).h < fVar6) {
            return;
          }
        }
        pvVar2 = nk_command_buffer_push(b,NK_COMMAND_RECT_FILLED,0x20);
        fStack_20 = rect.x;
        fStack_1c = rect.y;
        auVar8._8_8_ = rect._8_8_;
        auVar8._0_8_ = rect._8_8_;
        if (pvVar2 != (void *)0x0) {
          *(short *)((long)pvVar2 + 0x10) = (short)(int)rounding;
          auVar4._0_4_ = (int)fVar3;
          auVar4._4_4_ = (int)fVar6;
          auVar4._8_4_ = (int)fStack_20;
          auVar4._12_4_ = (int)fStack_1c;
          auVar4 = pshuflw(auVar4,auVar4,0xe8);
          *(int *)((long)pvVar2 + 0x12) = auVar4._0_4_;
          auVar8 = maxps(auVar8,(undefined1  [16])0x0);
          auVar5._0_4_ = (int)auVar8._0_4_;
          auVar5._4_4_ = (int)auVar8._4_4_;
          auVar5._8_4_ = (int)auVar8._8_4_;
          auVar5._12_4_ = (int)auVar8._12_4_;
          auVar8 = pshuflw(auVar5,auVar5,0xe8);
          *(int *)((long)pvVar2 + 0x16) = auVar8._0_4_;
          *(short *)((long)pvVar2 + 0x1a) = c._0_2_;
          *(nk_byte *)((long)pvVar2 + 0x1c) = c.b;
          *(nk_byte *)((long)pvVar2 + 0x1d) = c.a;
        }
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_fill_rect(struct nk_command_buffer *b, struct nk_rect rect,
    float rounding, struct nk_color c)
{
    struct nk_command_rect_filled *cmd;
    NK_ASSERT(b);
    if (!b || c.a == 0 || rect.w == 0 || rect.h == 0) return;
    if (b->use_clipping) {
        const struct nk_rect *clip = &b->clip;
        if (!NK_INTERSECT(rect.x, rect.y, rect.w, rect.h,
            clip->x, clip->y, clip->w, clip->h)) return;
    }

    cmd = (struct nk_command_rect_filled*)
        nk_command_buffer_push(b, NK_COMMAND_RECT_FILLED, sizeof(*cmd));
    if (!cmd) return;
    cmd->rounding = (unsigned short)rounding;
    cmd->x = (short)rect.x;
    cmd->y = (short)rect.y;
    cmd->w = (unsigned short)NK_MAX(0, rect.w);
    cmd->h = (unsigned short)NK_MAX(0, rect.h);
    cmd->color = c;
}